

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O3

ScalarFunction * duckdb::ReverseFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_c9;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  LogicalType local_a8 [24];
  LogicalType local_90 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  LogicalType local_40 [24];
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"reverse","");
  duckdb::LogicalType::LogicalType(local_90,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,&local_c9);
  duckdb::LogicalType::LogicalType(local_a8,VARCHAR);
  local_c0 = 0;
  local_c8 = ReverseFunction;
  local_b0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_40,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_40);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  duckdb::LogicalType::~LogicalType(local_a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return in_RDI;
}

Assistant:

ScalarFunction ReverseFun::GetFunction() {
	return ScalarFunction("reverse", {LogicalType::VARCHAR}, LogicalType::VARCHAR, ReverseFunction);
}